

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

Fl_Menu_Item * __thiscall Fl_Menu_Item::test_shortcut(Fl_Menu_Item *this)

{
  int iVar1;
  Fl_Menu_Item *local_38;
  Fl_Menu_Item *s;
  Fl_Menu_Item *ret;
  Fl_Menu_Item *m;
  Fl_Menu_Item *this_local;
  
  s = (Fl_Menu_Item *)0x0;
  ret = this;
  if (this != (Fl_Menu_Item *)0x0) {
    for (; ret->text != (char *)0x0; ret = next_visible_or_not(ret)) {
      iVar1 = active(ret);
      if (iVar1 != 0) {
        iVar1 = Fl::test_shortcut(ret->shortcut_);
        if (iVar1 != 0) {
          return ret;
        }
        if ((s == (Fl_Menu_Item *)0x0) && (iVar1 = submenu(ret), iVar1 != 0)) {
          if ((ret->flags & 0x40U) == 0) {
            local_38 = (Fl_Menu_Item *)ret->user_data_;
          }
          else {
            local_38 = ret + 1;
          }
          s = test_shortcut(local_38);
        }
      }
    }
  }
  return s;
}

Assistant:

const Fl_Menu_Item* Fl_Menu_Item::test_shortcut() const {
  const Fl_Menu_Item* m = this;
  const Fl_Menu_Item* ret = 0;
  if (m) for (; m->text; m = next_visible_or_not(m)) {
    if (m->active()) {
      // return immediately any match of an item in top level menu:
      if (Fl::test_shortcut(m->shortcut_)) return m;
      // if (Fl_Widget::test_shortcut(m->text)) return m;
      // only return matches from lower menu if nothing found in top menu:
      if (!ret && m->submenu()) {
	const Fl_Menu_Item* s =
	  (m->flags&FL_SUBMENU) ? m+1:(const Fl_Menu_Item*)m->user_data_;
	ret = s->test_shortcut();
      }
    }
  }
  return ret;
}